

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

uint32_t * gravity_bytecode_deserialize(char *buffer,size_t len,uint32_t *n)

{
  char cVar1;
  uint uVar2;
  uint32_t *__ptr;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  uVar2 = (uint)(len >> 3) & 0x1fffffff;
  __ptr = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(uVar2 * 4 + 4));
  if (7 < (uint)len) {
    uVar3 = 0;
    do {
      lVar5 = 0;
      uVar4 = 0;
      do {
        cVar1 = buffer[lVar5];
        iVar6 = -0x37;
        if ((5 < (byte)(cVar1 + 0xbfU)) && (iVar6 = -0x30, 9 < (byte)(cVar1 - 0x30U))) {
          *n = 0;
          if (__ptr != (uint32_t *)0x0) {
            free(__ptr);
          }
          return (uint32_t *)0x0;
        }
        uVar4 = uVar4 << 4 | iVar6 + cVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      __ptr[uVar3] = uVar4;
      uVar3 = uVar3 + 1;
      buffer = buffer + 8;
    } while (uVar3 != uVar2 + ((len >> 3 & 0x1fffffff) == 0));
  }
  *n = uVar2;
  return __ptr;
}

Assistant:

uint32_t *gravity_bytecode_deserialize (const char *buffer, size_t len, uint32_t *n) {
    uint32_t ninst = (uint32_t)len / 8;
    uint32_t *bytecode = (uint32_t *)mem_alloc(NULL, sizeof(uint32_t) * (ninst + 1));    // +1 to get a 0 terminated bytecode (0 is opcode RET0)

    for (uint32_t j=0; j<ninst; ++j) {
        register uint32_t v = 0;

        for (uint32_t i=(j*8); i<=(j*8)+7; ++i) {
            // I was using a conversion code from
            // https://code.google.com/p/yara-project/source/browse/trunk/libyara/xtoi.c?r=150
            // but it caused issues under ARM processor so I decided to switch to an easier to read/maintain code
            // http://codereview.stackexchange.com/questions/42976/hexadecimal-to-integer-conversion-function

            // no needs to have also the case:
            // if (c >= 'a' && c <= 'f') {
            //        c = c - 'a' + 10;
            // }
            // because bytecode is always uppercase
            register uint32_t c = buffer[i];

            if (c >= 'A' && c <= 'F') {
                c = c - 'A' + 10;
            } else if (c >= '0' && c <= '9') {
                c -= '0';
            } else goto abort_conversion;

            v = v << 4 | c;

        }

        bytecode[j] = v;
    }

    *n = ninst;
    return bytecode;

abort_conversion:
    *n = 0;
    if (bytecode) mem_free(bytecode);
    return NULL;
}